

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::elasticityFilterReturn
          (Highs *this,HighsStatus return_status,bool feasible_model,HighsInt original_num_col,
          HighsInt original_num_row,vector<double,_std::allocator<double>_> *original_col_cost,
          vector<double,_std::allocator<double>_> *original_col_lower,
          vector<double,_std::allocator<double>_> *original_col_upper,
          vector<HighsVarType,_std::allocator<HighsVarType>_> *original_integrality)

{
  double dVar1;
  HighsVarType *integrality;
  int to_col;
  
  dVar1 = (this->info_).super_HighsInfoStruct.objective_function_value;
  deleteRows(this,original_num_row,(this->model_).lp_.num_row_ + -1);
  deleteCols(this,original_num_col,(this->model_).lp_.num_col_ + -1);
  (this->basis_).valid = false;
  to_col = original_num_col + -1;
  changeColsCost(this,0,to_col,
                 (original_col_cost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start);
  changeColsBounds(this,0,to_col,
                   (original_col_lower->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                   .super__Vector_impl_data._M_start,
                   (original_col_upper->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                   .super__Vector_impl_data._M_start);
  integrality = (original_integrality->
                super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if ((original_integrality->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>).
      _M_impl.super__Vector_impl_data._M_finish != integrality) {
    changeColsIntegrality(this,0,to_col,integrality);
  }
  if (return_status == kOk) {
    HighsSparseMatrix::productQuad
              (&(this->model_).lp_.a_matrix_,&(this->solution_).row_value,
               &(this->solution_).col_value,-2);
    (this->solution_).value_valid = true;
    (this->info_).super_HighsInfoStruct.objective_function_value = dVar1;
    getKktFailures(&this->options_,&this->model_,&this->solution_,&this->basis_,&this->info_);
    (this->info_).super_HighsInfoStruct.valid = true;
  }
  if (feasible_model) {
    this->model_status_ = kMin;
  }
  return return_status;
}

Assistant:

HighsStatus Highs::elasticityFilterReturn(
    const HighsStatus return_status, const bool feasible_model,
    const HighsInt original_num_col, const HighsInt original_num_row,
    const std::vector<double>& original_col_cost,
    const std::vector<double>& original_col_lower,
    const std::vector<double> original_col_upper,
    const std::vector<HighsVarType> original_integrality) {
  const HighsLp& lp = this->model_.lp_;
  double objective_function_value = info_.objective_function_value;
  // Delete any additional rows and columns, and restore the original
  // column costs and bounds
  HighsStatus run_status;
  run_status = this->deleteRows(original_num_row, lp.num_row_ - 1);
  assert(run_status == HighsStatus::kOk);

  run_status = this->deleteCols(original_num_col, lp.num_col_ - 1);
  assert(run_status == HighsStatus::kOk);
  //
  // Now that deleteRows and deleteCols may yield a valid basis, the
  // lack of dual values triggers an assert in
  // getKktFailures. Ultimately (#2081) the dual values will be
  // available but, for now, make the basis invalid.
  basis_.valid = false;

  run_status =
      this->changeColsCost(0, original_num_col - 1, original_col_cost.data());
  assert(run_status == HighsStatus::kOk);

  run_status =
      this->changeColsBounds(0, original_num_col - 1, original_col_lower.data(),
                             original_col_upper.data());
  assert(run_status == HighsStatus::kOk);

  if (original_integrality.size()) {
    this->changeColsIntegrality(0, original_num_col - 1,
                                original_integrality.data());
    assert(run_status == HighsStatus::kOk);
  }

  assert(lp.num_col_ == original_num_col);
  assert(lp.num_row_ == original_num_row);

  if (return_status == HighsStatus::kOk) {
    // Solution is invalidated by deleting rows and columns, but
    // primal values are correct. Have to recompute row activities,
    // though
    this->model_.lp_.a_matrix_.productQuad(this->solution_.row_value,
                                           this->solution_.col_value);
    this->solution_.value_valid = true;
    // Set the feasibility objective and any KKT failures
    info_.objective_function_value = objective_function_value;
    getKktFailures(options_, model_, solution_, basis_, info_);
    info_.valid = true;
  }

  // If the model is feasible, then the status of model is not known
  if (feasible_model) this->model_status_ = HighsModelStatus::kNotset;

  return return_status;
}